

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::addConversion
          (TIntermediate *this,TOperator op,TType *type,TIntermTyped *node)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TBasicType TVar4;
  TBasicType to;
  EShSource EVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TIntermTyped *pTVar8;
  bool local_73;
  bool local_72;
  bool local_71;
  TIntermTyped *newNode;
  bool canPromoteConstant;
  TIntermTyped *node_local;
  TType *type_local;
  TOperator op_local;
  TIntermediate *this_local;
  
  bVar1 = isConversionAllowed(this,op,node);
  if (!bVar1) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar1 = TType::operator==(type,(TType *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    return node;
  }
  uVar3 = (*type->_vptr_TType[0x25])();
  if (((uVar3 & 1) != 0) ||
     (uVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2d])(), (uVar3 & 1) != 0)) {
    return (TIntermTyped *)0x0;
  }
  uVar3 = (*type->_vptr_TType[0x1d])();
  if ((uVar3 & 1) != 0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xe8))();
  if ((uVar7 & 1) != 0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar1 = TType::isCoopMat((TType *)CONCAT44(extraout_var_01,iVar2));
  if (((bVar1) && (op != EOpConstructCooperativeMatrixNV)) &&
     (op != EOpConstructCooperativeMatrixKHR)) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar1 = TType::isTensorLayoutNV((TType *)CONCAT44(extraout_var_02,iVar2));
  if (bVar1) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar1 = TType::isTensorViewNV((TType *)CONCAT44(extraout_var_03,iVar2));
  if (bVar1) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar1 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_04,iVar2));
  if ((bVar1) && (op != EOpConstructCooperativeVectorNV)) {
    return (TIntermTyped *)0x0;
  }
  if ((((op != EOpSequence) && (op != EOpFunctionCall)) &&
      ((op != EOpLogicalNot &&
       ((((op != EOpMod && (op != EOpAtan)) && (op != EOpPow)) &&
        ((6 < op - EOpModf && (2 < op - EOpFma)))))))) &&
     ((2 < op - EOpDistance && ((2 < op - EOpFaceForward && (op != EOpReturn)))))) {
    if ((op - EOpConstructInt < 0xb) || (op == EOpConstructFloat16)) goto LAB_00739632;
    if ((((op != EOpConstructStruct) && (2 < op - EOpConstructCooperativeMatrixNV)) &&
        (3 < op - EOpAssign)) && ((1 < op - EOpVectorTimesScalarAssign && (4 < op - EOpDivAssign))))
    {
      if (op - EOpLeftShiftAssign < 2) {
        EVar5 = getSource(this);
        if (EVar5 == EShSourceHlsl) {
          iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar2) + 0x38))();
          if (iVar2 == 0xc) goto LAB_00739632;
        }
        TVar4 = (*type->_vptr_TType[7])();
        bVar1 = isTypeInt(TVar4);
        if (bVar1) {
          TVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
          bVar1 = isTypeInt(TVar4);
          if (bVar1) {
            return node;
          }
        }
        return (TIntermTyped *)0x0;
      }
      if ((op != EOpDst) && (op != EOpLit)) {
        iVar2 = (*type->_vptr_TType[7])();
        iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar6) + 0x38))();
        if (iVar2 != iVar6) {
          return (TIntermTyped *)0x0;
        }
        return node;
      }
    }
  }
  bVar1 = TType::isReference(type);
  if (!bVar1) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar1 = TType::isReference((TType *)CONCAT44(extraout_var_05,iVar2));
    if (!bVar1) {
      iVar2 = (*type->_vptr_TType[7])();
      iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0x38))();
      if (iVar2 == iVar6) {
        return node;
      }
      TVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
      to = (*type->_vptr_TType[7])();
      bVar1 = canImplicitlyPromote(this,TVar4,to,op);
      if (!bVar1) {
        return (TIntermTyped *)0x0;
      }
LAB_00739632:
      newNode._7_1_ = true;
      if (op - EOpConstructInt8 < 2) {
        bVar1 = TNumericFeatures::contains(&this->numericFeatures,shader_explicit_arithmetic_types);
        local_72 = true;
        if (!bVar1) {
          local_72 = TNumericFeatures::contains
                               (&this->numericFeatures,shader_explicit_arithmetic_types_int8);
        }
        newNode._7_1_ = local_72;
      }
      else if (op - EOpConstructInt16 < 2) {
        bVar1 = TNumericFeatures::contains(&this->numericFeatures,shader_explicit_arithmetic_types);
        local_73 = true;
        if (!bVar1) {
          local_73 = TNumericFeatures::contains
                               (&this->numericFeatures,shader_explicit_arithmetic_types_int16);
        }
        newNode._7_1_ = local_73;
      }
      else if (op == EOpConstructFloat16) {
        bVar1 = TNumericFeatures::contains(&this->numericFeatures,shader_explicit_arithmetic_types);
        local_71 = true;
        if (!bVar1) {
          local_71 = TNumericFeatures::contains
                               (&this->numericFeatures,shader_explicit_arithmetic_types_float16);
        }
        newNode._7_1_ = local_71;
      }
      if ((newNode._7_1_ != false) &&
         (iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(),
         CONCAT44(extraout_var_10,iVar2) != 0)) {
        TVar4 = (*type->_vptr_TType[7])();
        iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])();
        pTVar8 = promoteConstantUnion
                           (this,TVar4,(TIntermConstantUnion *)CONCAT44(extraout_var_11,iVar2));
        return pTVar8;
      }
      TVar4 = (*type->_vptr_TType[7])();
      pTVar8 = createConversion(this,TVar4,node);
      return pTVar8;
    }
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar1 = TType::operator==(type,(TType *)CONCAT44(extraout_var_06,iVar2));
  if (!bVar1) {
    return (TIntermTyped *)0x0;
  }
  return node;
}

Assistant:

TIntermTyped* TIntermediate::addConversion(TOperator op, const TType& type, TIntermTyped* node)
{
    if (!isConversionAllowed(op, node))
        return nullptr;

    // Otherwise, if types are identical, no problem
    if (type == node->getType())
        return node;

    // If one's a structure, then no conversions.
    if (type.isStruct() || node->isStruct())
        return nullptr;

    // If one's an array, then no conversions.
    if (type.isArray() || node->getType().isArray())
        return nullptr;

    // Reject implicit conversions to cooperative matrix types
    if (node->getType().isCoopMat() &&
        op != EOpConstructCooperativeMatrixNV &&
        op != EOpConstructCooperativeMatrixKHR)
        return nullptr;

    if (node->getType().isTensorLayoutNV() ||
        node->getType().isTensorViewNV())
        return nullptr;

    // Reject implicit conversions to cooperative vector types
    if (node->getType().isCoopVecNV() &&
        op != EOpConstructCooperativeVectorNV)
        return nullptr;

    // Note: callers are responsible for other aspects of shape,
    // like vector and matrix sizes.

    switch (op) {
    //
    // Explicit conversions (unary operations)
    //
    case EOpConstructBool:
    case EOpConstructFloat:
    case EOpConstructInt:
    case EOpConstructUint:
    case EOpConstructDouble:
    case EOpConstructFloat16:
    case EOpConstructInt8:
    case EOpConstructUint8:
    case EOpConstructInt16:
    case EOpConstructUint16:
    case EOpConstructInt64:
    case EOpConstructUint64:
        break;

    //
    // Implicit conversions
    //
    case EOpLogicalNot:

    case EOpFunctionCall:

    case EOpReturn:
    case EOpAssign:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpMulAssign:
    case EOpVectorTimesScalarAssign:
    case EOpMatrixTimesScalarAssign:
    case EOpDivAssign:
    case EOpModAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:

    case EOpAtan:
    case EOpClamp:
    case EOpCross:
    case EOpDistance:
    case EOpDot:
    case EOpDst:
    case EOpFaceForward:
    case EOpFma:
    case EOpFrexp:
    case EOpLdexp:
    case EOpMix:
    case EOpLit:
    case EOpMax:
    case EOpMin:
    case EOpMod:
    case EOpModf:
    case EOpPow:
    case EOpReflect:
    case EOpRefract:
    case EOpSmoothStep:
    case EOpStep:

    case EOpSequence:
    case EOpConstructStruct:
    case EOpConstructCooperativeMatrixNV:
    case EOpConstructCooperativeMatrixKHR:
    case EOpConstructCooperativeVectorNV:

        if (type.isReference() || node->getType().isReference()) {
            // types must match to assign a reference
            if (type == node->getType())
                return node;
            else
                return nullptr;
        }

        if (type.getBasicType() == node->getType().getBasicType())
            return node;

        if (! canImplicitlyPromote(node->getBasicType(), type.getBasicType(), op))
            return nullptr;
        break;

    // For GLSL, there are no conversions needed; the shift amount just needs to be an
    // integer type, as do the base/result.
    // HLSL can convert the shift from a bool to an int.
    case EOpLeftShiftAssign:
    case EOpRightShiftAssign:
    {
        if (!(getSource() == EShSourceHlsl && node->getType().getBasicType() == EbtBool)) {
            if (isTypeInt(type.getBasicType()) && isTypeInt(node->getBasicType()))
                return node;
            else
                return nullptr;
        }
        break;
    }

    default:
        // default is to require a match; all exceptions should have case statements above

        if (type.getBasicType() == node->getType().getBasicType())
            return node;
        else
            return nullptr;
    }

    bool canPromoteConstant = true;
    // GL_EXT_shader_16bit_storage can't do OpConstantComposite with
    // 16-bit types, so disable promotion for those types.
    // Many issues with this, from JohnK:
    //  - this isn't really right to discuss SPIR-V here
    //  - this could easily be entirely about scalars, so is overstepping
    //  - we should be looking at what the shader asked for, and saying whether or
    //    not it can be done, in the parser, by calling requireExtensions(), not
    //    changing language sementics on the fly by asking what extensions are in use
    //  - at the time of this writing (14-Aug-2020), no test results are changed by this.
    switch (op) {
    case EOpConstructFloat16:
        canPromoteConstant = numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types) ||
                             numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_float16);
        break;
    case EOpConstructInt8:
    case EOpConstructUint8:
        canPromoteConstant = numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types) ||
                             numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int8);
        break;
    case EOpConstructInt16:
    case EOpConstructUint16:
        canPromoteConstant = numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types) ||
                             numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int16);
        break;
    default:
        break;
    }

    if (canPromoteConstant && node->getAsConstantUnion())
        return promoteConstantUnion(type.getBasicType(), node->getAsConstantUnion());

    //
    // Add a new newNode for the conversion.
    //
    TIntermTyped* newNode = createConversion(type.getBasicType(), node);

    return newNode;
}